

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Cylinder(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var8;
  string *psVar9;
  int pAttrIdx;
  ulong uVar10;
  pointer paVar11;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  CX3DImporter_NodeElement *ne;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tcir;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tside;
  string an;
  string def;
  string use;
  bool local_f8;
  bool local_f7;
  bool local_f6;
  bool local_f5;
  float local_f4;
  CX3DImporter_NodeElement *local_f0;
  float local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  X3DImporter *local_38;
  undefined4 extraout_var_00;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_f0 = (CX3DImporter_NodeElement *)0x0;
  uVar6 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar6 < 1) {
    local_e8 = 2.0;
    uStack_e4 = 0;
    uStack_e0 = 0;
    uStack_dc = 0;
    local_f4 = 1.0;
    local_f6 = true;
    local_f5 = true;
    local_f8 = true;
    local_f7 = true;
  }
  else {
    uVar10 = 0;
    local_f4 = 1.0;
    local_e8 = 2.0;
    uStack_e4 = 0;
    uStack_e0 = 0;
    uStack_dc = 0;
    local_f7 = true;
    local_f8 = true;
    local_f5 = true;
    local_f6 = true;
    local_38 = this;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar10;
      iVar7 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,(char *)CONCAT44(extraout_var,iVar7),
                 (allocator<char> *)&local_b8);
      iVar7 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar7 == 0) {
        iVar7 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar7);
        psVar9 = &local_78;
LAB_006adf1b:
        pcVar3 = (char *)psVar9->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar9,0,pcVar3,(ulong)__s);
        this = local_38;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar7 == 0) {
          iVar7 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar7);
          psVar9 = &local_58;
          goto LAB_006adf1b;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_98);
        if (((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&local_98), iVar7 != 0))
           && (iVar7 = std::__cxx11::string::compare((char *)&local_98), iVar7 != 0)) {
          iVar7 = std::__cxx11::string::compare((char *)&local_98);
          if (iVar7 == 0) {
            local_f4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_98);
            if (iVar7 == 0) {
              local_f5 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_98);
              if (iVar7 == 0) {
                local_f7 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_98);
                if (iVar7 == 0) {
                  local_f8 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_98);
                  if (iVar7 == 0) {
                    local_f6 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)&local_98);
                    if (iVar7 == 0) {
                      local_e8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                      uStack_e4 = extraout_XMM0_Db;
                      uStack_e0 = extraout_XMM0_Dc;
                      uStack_dc = extraout_XMM0_Dd;
                    }
                    else {
                      Throw_IncorrectAttr(this,&local_98);
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      uVar10 = (ulong)(pAttrIdx + 1U);
    } while (uVar6 != pAttrIdx + 1U);
  }
  if (local_58._M_string_length == 0) {
    local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0 = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    local_f0->Type = ENET_Cylinder;
    (local_f0->ID)._M_dataplus._M_p = (pointer)&(local_f0->ID).field_2;
    (local_f0->ID)._M_string_length = 0;
    (local_f0->ID).field_2._M_local_buf[0] = '\0';
    local_f0->Parent = pCVar4;
    (local_f0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_f0->Child;
    (local_f0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_f0->Child;
    (local_f0->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_f0->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry3D_008ff850;
    local_f0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_f0[1].Type = 0;
    *(CX3DImporter_NodeElement **)&local_f0[1].Type = local_f0 + 1;
    local_f0[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_f0 + 1);
    local_f0[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_f0[1].ID._M_string_length = 0;
    local_f0[1].ID.field_2._M_local_buf[0] = '\x01';
    if (local_78._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_f0->ID);
    }
    if (local_f6 != false) {
      StandardShapes::MakeCone(local_e8,local_f4,local_f4,0x1e,&local_b8,true);
    }
    paVar11 = local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar4 = local_f0;
    if (local_f8 != false || local_f7 != false) {
      StandardShapes::MakeCircle(local_f4,0x1e,&local_d8);
      paVar11 = local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar4 = local_f0;
    }
    for (; paVar11 !=
           local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish; paVar11 = paVar11 + 1) {
      p_Var8 = (_List_node_base *)operator_new(0x20);
      *(float *)&p_Var8[1]._M_prev = paVar11->z;
      p_Var8[1]._M_next = *(_List_node_base **)paVar11;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
    }
    local_e8 = local_e8 * 0.5;
    paVar11 = local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_f8 != false) {
      for (; paVar11 !=
             local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish; paVar11 = paVar11 + 1) {
        paVar11->y = local_e8;
        p_Var8 = (_List_node_base *)operator_new(0x20);
        *(float *)&p_Var8[1]._M_prev = paVar11->z;
        p_Var8[1]._M_next = *(_List_node_base **)paVar11;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
      }
    }
    if ((local_f7 != false) &&
       (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      local_e8 = -local_e8;
      uStack_e4 = uStack_e4 ^ 0x80000000;
      uStack_e0 = uStack_e0 ^ 0x80000000;
      uStack_dc = uStack_dc ^ 0x80000000;
      paVar11 = local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        paVar11->y = local_e8;
        p_Var8 = (_List_node_base *)operator_new(0x20);
        *(float *)&p_Var8[1]._M_prev = paVar11->z;
        p_Var8[1]._M_next = *(_List_node_base **)paVar11;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
        paVar11 = paVar11 + 1;
      } while (paVar11 !=
               local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_f0[1].ID.field_2._M_local_buf[0] = local_f5;
    local_f0[1].ID._M_string_length = 3;
    iVar7 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_f0;
    if ((char)iVar7 == '\0') {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Cylinder","");
      ParseNode_Metadata(this,pCVar4,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var8 = (_List_node_base *)operator_new(0x18);
      p_Var8[1]._M_next = (_List_node_base *)local_f0;
      std::__detail::_List_node_base::_M_hook(p_Var8);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_f0;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(this->NodeElement_List).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_78._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar5 = FindNodeElement(this,&local_58,ENET_Cylinder,&local_f0);
    if (!bVar5) {
      Throw_USE_NotFound(this,&local_58);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_f0;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Cylinder()
{
    std::string use, def;
    bool bottom = true;
    float height = 2;
    float radius = 1;
    bool side = true;
    bool solid = true;
    bool top = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("bottom", bottom, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("top", top, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("side", side, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("height", height, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Cylinder, ne);
	}
	else
	{
		const unsigned int tess = 30;///TODO: IME tessellation factor through ai_property

		std::vector<aiVector3D> tside;// temp array for vertices of side.
		std::vector<aiVector3D> tcir;// temp array for vertices of circle.

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Cylinder, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// make cilynder or parts according to flags.
		if(side) StandardShapes::MakeCone(height, radius, radius, tess, tside, true);

		height /= 2;// height defined for whole cylinder, when creating top and bottom circle we are using just half of height.
		if(top || bottom) StandardShapes::MakeCircle(radius, tess, tcir);
		// copy data from temp arrays
		std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices;// just short alias.

		for(std::vector<aiVector3D>::iterator it = tside.begin(); it != tside.end(); ++it) vlist.push_back(*it);

		if(top)
		{
			for(std::vector<aiVector3D>::iterator it = tcir.begin(); it != tcir.end(); ++it)
			{
				(*it).y = height;// y - because circle made in oXZ.
				vlist.push_back(*it);
			}
		}// if(top)

		if(bottom)
		{
			for(std::vector<aiVector3D>::iterator it = tcir.begin(); it != tcir.end(); ++it)
			{
				(*it).y = -height;// y - because circle made in oXZ.
				vlist.push_back(*it);
			}
		}// if(top)

		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Cylinder");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}